

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char * tk_to_string(Tk *tk)

{
  Tk *tk_local;
  
  tk_local = tk;
  if (0xff < *tk) {
    tk_local = (Tk *)TK_NAMES[*tk];
  }
  return (char *)tk_local;
}

Assistant:

char * tk_to_string(Tk *tk) {
	if (*tk < 256) {
		// ASCII code
		return (char *) tk;
	} else {
		// Multi-character token
		return TK_NAMES[*tk];
	}
}